

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.hpp
# Opt level: O1

bool __thiscall
Diligent::DeviceObjectArchive::
LoadResourceCommonData<Diligent::DearchiverBase::PSOData<Diligent::TilePipelineStateCreateInfo>>
          (DeviceObjectArchive *this,ResourceType Type,char *Name,
          PSOData<Diligent::TilePipelineStateCreateInfo> *ResData)

{
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  PSOData<Diligent::TilePipelineStateCreateInfo> *pPVar4;
  char (*Args_1) [40];
  char *pcVar5;
  char (*in_R8) [32];
  string _msg;
  Serializer<(Diligent::SerializerMode)0> Ser;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  char *local_38;
  Serializer<(Diligent::SerializerMode)0> local_30;
  undefined7 uVar6;
  
  pPVar4 = ResData;
  local_58._0_4_ = Type;
  local_38 = Name;
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)(local_58 + 8),Name,false);
  cVar3 = std::
          _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,(key_type *)local_58);
  if (((Char *)local_58._8_8_ != (Char *)0x0) && ((long)aStack_48._M_allocated_capacity < 0)) {
    operator_delete__((void *)local_58._8_8_);
  }
  local_58._8_8_ = (Char *)0x0;
  aStack_48._M_allocated_capacity = 0;
  if (cVar3.
      super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
      ._M_cur != (__node_type *)0x0) {
    pcVar5 = *(char **)((long)cVar3.
                              super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                              ._M_cur + 0x10);
    uVar6 = (undefined7)((ulong)pPVar4 >> 8);
    Args_1 = (char (*) [40])CONCAT71(uVar6,pcVar5 != (char *)0x0);
    if (((local_38 == (char *)0x0) == (pcVar5 != (char *)0x0)) ||
       ((Args_1 = (char (*) [40])CONCAT71(uVar6,local_38 == (char *)0x0 || pcVar5 == (char *)0x0),
        local_38 != (char *)0x0 && pcVar5 != (char *)0x0 &&
        (iVar2 = strcmp(local_38,pcVar5), iVar2 != 0)))) {
      FormatString<char[26],char[40]>
                ((string *)local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SafeStrEqual(Name, it->first.GetName())",Args_1);
      DebugAssertionFailed
                ((Char *)CONCAT44(local_58._4_4_,local_58._0_4_),"LoadResourceCommonData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectArchive.hpp"
                 ,0x106);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_58._4_4_,local_58._0_4_) != &aStack_48) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_58._4_4_,local_58._0_4_),
                        aStack_48._M_allocated_capacity + 1);
      }
    }
    local_38 = *(char **)((long)cVar3.
                                super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                                ._M_cur + 0x10);
    local_30.m_Start =
         *(TPointer *)
          ((long)cVar3.
                 super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                 ._M_cur + 0x28);
    pcVar5 = *(char (*) [14])local_30.m_Start +
             *(long *)((long)cVar3.
                             super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                             ._M_cur + 0x30);
    local_30.m_End = (TPointer)pcVar5;
    local_30.m_Ptr = local_30.m_Start;
    bVar1 = DearchiverBase::PSOData<Diligent::TilePipelineStateCreateInfo>::Deserialize
                      (ResData,local_38,&local_30);
    if (local_30.m_Ptr != local_30.m_End) {
      FormatString<char[26],char[14]>
                ((string *)local_58,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x76866c
                 ,(char (*) [14])pcVar5);
      DebugAssertionFailed
                ((Char *)CONCAT44(local_58._4_4_,local_58._0_4_),"LoadResourceCommonData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectArchive.hpp"
                 ,0x10d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_58._4_4_,local_58._0_4_) != &aStack_48) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_58._4_4_,local_58._0_4_),
                        aStack_48._M_allocated_capacity + 1);
      }
    }
    return bVar1;
  }
  FormatString<char[11],char_const*,char[32]>
            ((string *)local_58,(Diligent *)"Resource \'",(char (*) [11])&local_38,
             (char **)"\' is not present in the archive",in_R8);
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(2,CONCAT44(local_58._4_4_,local_58._0_4_),0,0,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_58._4_4_,local_58._0_4_) != &aStack_48) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_58._4_4_,local_58._0_4_),aStack_48._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool LoadResourceCommonData(ResourceType     Type,
                                const char*      Name,
                                ReourceDataType& ResData) const
    {
        auto it = m_NamedResources.find(NamedResourceKey{Type, Name});
        if (it == m_NamedResources.end())
        {
            LOG_ERROR_MESSAGE("Resource '", Name, "' is not present in the archive");
            return false;
        }
        VERIFY_EXPR(SafeStrEqual(Name, it->first.GetName()));
        // Use string copy from the map
        Name = it->first.GetName();

        Serializer<SerializerMode::Read> Ser{it->second.Common};

        auto Res = ResData.Deserialize(Name, Ser);
        VERIFY_EXPR(Ser.IsEnded());
        return Res;
    }